

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

lws * lws_wsi_server_new(lws_vhost *vh,lws *parent_wsi,uint sid)

{
  lws_h2_netconn *plVar1;
  int iVar2;
  lws *wsi_00;
  lws_h2_netconn *h2n;
  lws *nwsi;
  lws *wsi;
  uint sid_local;
  lws *parent_wsi_local;
  lws_vhost *vh_local;
  
  wsi_00 = lws_get_network_wsi(parent_wsi);
  plVar1 = (wsi_00->h2).h2n;
  if (plVar1->highest_sid_opened < sid) {
    if ((((parent_wsi->h2).h2n)->our_set).s[3] < (parent_wsi->mux).child_count + 1) {
      _lws_log(4,"reached concurrent stream limit\n");
      vh_local = (lws_vhost *)0x0;
    }
    else {
      vh_local = (lws_vhost *)lws_create_new_server_wsi(vh,(int)parent_wsi->tsi);
      if ((lws *)vh_local == (lws *)0x0) {
        _lws_log(4,"new server wsi failed (vh %p)\n",vh);
        vh_local = (lws_vhost *)0x0;
      }
      else {
        plVar1->highest_sid_opened = sid;
        lws_wsi_mux_insert((lws *)vh_local,parent_wsi,sid);
        *(ulong *)&((lws *)vh_local)->field_0x2dc =
             *(ulong *)&((lws *)vh_local)->field_0x2dc & 0xfffffffffffffffd | 2;
        *(ulong *)&((lws *)vh_local)->field_0x2dc =
             *(ulong *)&((lws *)vh_local)->field_0x2dc & 0xffffffffffffff7f;
        (((lws *)vh_local)->txc).tx_cr = (((wsi_00->h2).h2n)->peer_set).s[4];
        (((lws *)vh_local)->txc).peer_tx_cr_est = (((wsi_00->h2).h2n)->our_set).s[4];
        lwsi_set_state((lws *)vh_local,0x119);
        lwsi_set_role((lws *)vh_local,parent_wsi->wsistate & 0xffff0000);
        ((lws *)vh_local)->protocol = vh->protocols;
        iVar2 = lws_ensure_user_space((lws *)vh_local);
        if (iVar2 == 0) {
          lws_validity_confirmed((lws *)vh_local);
          _lws_log(8,"%s: %p new ch %p, sid %d, usersp=%p\n","lws_wsi_server_new",parent_wsi,
                   vh_local,(ulong)sid,((lws *)vh_local)->user_space);
          lws_wsi_txc_describe
                    (&((lws *)vh_local)->txc,"lws_wsi_server_new",(((lws *)vh_local)->mux).my_sid);
          lws_wsi_txc_describe(&wsi_00->txc,"lws_wsi_server_new",0);
        }
        else {
          (parent_wsi->mux).child_list = (((lws *)vh_local)->mux).sibling_list;
          (parent_wsi->mux).child_count = (parent_wsi->mux).child_count - 1;
          vh->context->count_wsi_allocated = vh->context->count_wsi_allocated + -1;
          if (((lws *)vh_local)->user_space != (void *)0x0) {
            lws_realloc(((lws *)vh_local)->user_space,0,"free");
            ((lws *)vh_local)->user_space = (void *)0x0;
          }
          (*vh->protocols->callback)
                    ((lws *)vh_local,LWS_CALLBACK_WSI_DESTROY,(void *)0x0,(void *)0x0,0);
          lws_vhost_unbind_wsi((lws *)vh_local);
          lws_realloc(vh_local,0,"lws_free");
          vh_local = (lws_vhost *)0x0;
        }
      }
    }
  }
  else {
    _lws_log(8,"%s: tried to open lower sid %d (%d)\n","lws_wsi_server_new",(ulong)sid,
             (ulong)plVar1->highest_sid_opened);
    lws_h2_goaway(wsi_00,1,"Bad sid");
    vh_local = (lws_vhost *)0x0;
  }
  return (lws *)vh_local;
}

Assistant:

struct lws *
lws_wsi_server_new(struct lws_vhost *vh, struct lws *parent_wsi,
			    unsigned int sid)
{
	struct lws *wsi;
	struct lws *nwsi = lws_get_network_wsi(parent_wsi);
	struct lws_h2_netconn *h2n = nwsi->h2.h2n;

	/*
	 * The identifier of a newly established stream MUST be numerically
   	 * greater than all streams that the initiating endpoint has opened or
   	 * reserved.  This governs streams that are opened using a HEADERS frame
   	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
   	 * receives an unexpected stream identifier MUST respond with a
   	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	if (sid <= h2n->highest_sid_opened) {
		lwsl_info("%s: tried to open lower sid %d (%d)\n", __func__,
				sid, (int)h2n->highest_sid_opened);
		lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR, "Bad sid");
		return NULL;
	}

	/* no more children allowed by parent */
	if (parent_wsi->mux.child_count + 1 >
	    parent_wsi->h2.h2n->our_set.s[H2SET_MAX_CONCURRENT_STREAMS]) {
		lwsl_notice("reached concurrent stream limit\n");
		return NULL;
	}
	wsi = lws_create_new_server_wsi(vh, parent_wsi->tsi);
	if (!wsi) {
		lwsl_notice("new server wsi failed (vh %p)\n", vh);
		return NULL;
	}

	h2n->highest_sid_opened = sid;

	lws_wsi_mux_insert(wsi, parent_wsi, sid);

	wsi->mux_substream = 1;
	wsi->seen_nonpseudoheader = 0;

	wsi->txc.tx_cr = nwsi->h2.h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];
	wsi->txc.peer_tx_cr_est =
			nwsi->h2.h2n->our_set.s[H2SET_INITIAL_WINDOW_SIZE];

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	lwsi_set_role(wsi, lwsi_role(parent_wsi));

	wsi->protocol = &vh->protocols[0];
	if (lws_ensure_user_space(wsi))
		goto bail1;

#if defined(LWS_WITH_SERVER_STATUS)
	wsi->vhost->conn_stats.h2_subs++;
#endif

	/* get the ball rolling */
	lws_validity_confirmed(wsi);

	lwsl_info("%s: %p new ch %p, sid %d, usersp=%p\n", __func__,
		  parent_wsi, wsi, sid, wsi->user_space);

	lws_wsi_txc_describe(&wsi->txc, __func__, wsi->mux.my_sid);
	lws_wsi_txc_describe(&nwsi->txc, __func__, 0);

	return wsi;

bail1:
	/* undo the insert */
	parent_wsi->mux.child_list = wsi->mux.sibling_list;
	parent_wsi->mux.child_count--;

	vh->context->count_wsi_allocated--;

	if (wsi->user_space)
		lws_free_set_NULL(wsi->user_space);
	vh->protocols[0].callback(wsi, LWS_CALLBACK_WSI_DESTROY, NULL, NULL, 0);
	lws_vhost_unbind_wsi(wsi);
	lws_free(wsi);

	return NULL;
}